

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O1

double MatDet(double *A,int row)

{
  int *list;
  ulong uVar1;
  double dVar2;
  
  list = (int *)malloc((long)row * 4);
  if (0 < row) {
    uVar1 = 0;
    do {
      list[uVar1] = (int)uVar1;
      uVar1 = uVar1 + 1;
    } while ((uint)row != uVar1);
  }
  dVar2 = det(A,row,0,list,0.0);
  free(list);
  return dVar2;
}

Assistant:

double MatDet(double *A, int row) {
    int *list = (int *) malloc(sizeof(int) * row);
    for (int i = 0; i < row; i++)
        list[i] = i;
    double Out = det(A, row, 0, list, 0.0);
    free(list);
    return Out;
}